

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O3

void read_fare_attributes
               (fare_attributes_t *record,int field_count,char **field_names,char **field_values)

{
  char cVar1;
  int iVar2;
  transfers_state_t tVar3;
  payment_method_t pVar4;
  ulong uVar5;
  char *pcVar6;
  fare_attributes_t *__dest;
  double dVar7;
  
  record->fare_id[0] = '\0';
  record->price = 0.0;
  record->currency_type[0] = '\0';
  record->payment_method = PM_NOT_SET;
  record->transfers = TS_NOT_SET;
  record->agency_id[0] = '\0';
  record->transfer_duration = 0.0;
  if (0 < field_count) {
    uVar5 = 0;
    do {
      pcVar6 = field_names[uVar5];
      iVar2 = strcmp(pcVar6,"fare_id");
      if (iVar2 == 0) {
        pcVar6 = field_values[uVar5];
        __dest = record;
LAB_00119621:
        strcpy(__dest->fare_id,pcVar6);
      }
      else {
        iVar2 = strcmp(pcVar6,"price");
        if (iVar2 == 0) {
          dVar7 = atof(field_values[uVar5]);
          record->price = dVar7;
        }
        else {
          iVar2 = strcmp(pcVar6,"currency_type");
          if (iVar2 == 0) {
            pcVar6 = field_values[uVar5];
            __dest = (fare_attributes_t *)record->currency_type;
            goto LAB_00119621;
          }
          iVar2 = strcmp(pcVar6,"payment_method");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar6,"transfers");
            if (iVar2 == 0) {
              tVar3 = parse_transfer_state(field_values[uVar5]);
              record->transfers = tVar3;
            }
            else {
              iVar2 = strcmp(pcVar6,"agency_id");
              if (iVar2 == 0) {
                pcVar6 = field_values[uVar5];
                __dest = (fare_attributes_t *)record->agency_id;
                goto LAB_00119621;
              }
              iVar2 = strcmp(pcVar6,"transfer_duration");
              if (iVar2 == 0) {
                dVar7 = strtod(field_values[uVar5],(char **)0x0);
                record->transfer_duration = dVar7;
              }
            }
            goto LAB_00119626;
          }
          cVar1 = *field_values[uVar5];
          if (cVar1 == '0') {
            pVar4 = PM_ON_BOARD;
LAB_0011966d:
            if (field_values[uVar5][1] != '\0') {
              pVar4 = PM_NOT_SET;
            }
          }
          else {
            pVar4 = PM_NOT_SET;
            if (cVar1 == '1') {
              pVar4 = PM_BEFOREHAND;
              goto LAB_0011966d;
            }
          }
          record->payment_method = pVar4;
        }
      }
LAB_00119626:
      uVar5 = uVar5 + 1;
    } while ((uint)field_count != uVar5);
  }
  return;
}

Assistant:

void read_fare_attributes(fare_attributes_t *record, int field_count, const char **field_names, const char **field_values) {
    init_fare_attributes(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "fare_id") == 0) {
            strcpy(record->fare_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "price") == 0) {
            record->price = atof(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "currency_type") == 0) {
            strcpy(record->currency_type, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "payment_method") == 0) {
            record->payment_method = parse_payment_method(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfers") == 0) {
            record->transfers = parse_transfer_state(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->agency_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfer_duration") == 0) {
            record->transfer_duration = strtod(field_values[i], NULL);
            continue;
        }
    }
}